

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cc
# Opt level: O2

void re2c::BitMap::gen(OutputFile *o,uint32_t ind,uint32_t lb,uint32_t ub)

{
  ulong __n;
  uint *puVar1;
  uint32_t uVar2;
  long lVar3;
  uint32_t m;
  uint uVar4;
  uint32_t n;
  OutputFile *pOVar5;
  opt_t *poVar6;
  undefined8 *puVar7;
  void *__s;
  uint *puVar8;
  uint32_t j;
  uint uVar9;
  ulong uVar10;
  uint32_t n_00;
  uint *puVar11;
  ulong uVar12;
  uint uVar13;
  undefined8 *puVar14;
  
  if ((first != (undefined8 *)0x0) && (bUsedYYBitmap == '\x01')) {
    pOVar5 = OutputFile::wind(o,ind);
    pOVar5 = OutputFile::ws(pOVar5,"static const unsigned char ");
    poVar6 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    pOVar5 = OutputFile::wstring(pOVar5,&poVar6->yybm);
    OutputFile::ws(pOVar5,"[] = {");
    puVar14 = first;
    uVar9 = 0;
    puVar7 = first;
    do {
      puVar7 = (undefined8 *)puVar7[2];
      uVar9 = uVar9 + 1;
    } while (puVar7 != (undefined8 *)0x0);
    uVar13 = ub - lb;
    __n = (ulong)uVar13 * 4;
    __s = operator_new__(__n);
    n = 1;
    n_00 = 0;
    while (puVar14 != (undefined8 *)0x0) {
      memset(__s,0,__n);
      for (uVar4 = 0x80; (puVar14 != (undefined8 *)0x0 && (uVar4 != 0)); uVar4 = uVar4 >> 1) {
        *(uint32_t *)(puVar14 + 3) = n_00;
        *(uint *)((long)puVar14 + 0x1c) = uVar4;
        lVar3 = puVar14[1];
        puVar8 = *(uint **)((uint *)*puVar14 + 2);
        puVar11 = puVar8 + (ulong)*(uint *)*puVar14 * 4;
        uVar10 = 0;
        for (; puVar8 < puVar11; puVar8 = puVar8 + 4) {
          uVar12 = uVar10;
          if (*(long *)(puVar8 + 2) == lVar3) {
            for (; (uVar10 = (ulong)*puVar8, uVar12 < 0x100 && (uVar12 < uVar10));
                uVar12 = uVar12 + 1) {
              puVar1 = (uint *)((long)__s + (ulong)((int)uVar12 - lb) * 4);
              *puVar1 = *puVar1 | uVar4;
            }
          }
          else {
            uVar10 = (ulong)*puVar8;
          }
        }
        puVar14 = (undefined8 *)puVar14[2];
      }
      if (8 < uVar9) {
        pOVar5 = OutputFile::ws(o,"\n");
        pOVar5 = OutputFile::wind(pOVar5,ind + 1);
        pOVar5 = OutputFile::ws(pOVar5,"/* table ");
        pOVar5 = OutputFile::wu32(pOVar5,n);
        pOVar5 = OutputFile::ws(pOVar5," .. ");
        uVar2 = n + 7;
        if (uVar9 <= n + 7) {
          uVar2 = uVar9;
        }
        pOVar5 = OutputFile::wu32(pOVar5,uVar2);
        pOVar5 = OutputFile::ws(pOVar5,": ");
        pOVar5 = OutputFile::wu32(pOVar5,n_00);
        OutputFile::ws(pOVar5," */");
      }
      for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
        if ((uVar10 & 7) == 0) {
          pOVar5 = OutputFile::ws(o,"\n");
          OutputFile::wind(pOVar5,ind + 1);
        }
        poVar6 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        uVar2 = *(uint32_t *)((long)__s + uVar10 * 4);
        if (poVar6->yybmHexTable == true) {
          OutputFile::wu32_hex(o,uVar2);
        }
        else {
          OutputFile::wu32_width(o,uVar2,3);
        }
        OutputFile::ws(o,", ");
      }
      n_00 = n_00 + uVar13;
      n = n + 8;
    }
    pOVar5 = OutputFile::ws(o,"\n");
    pOVar5 = OutputFile::wind(pOVar5,ind);
    OutputFile::ws(pOVar5,"};\n");
    operator_delete__(__s);
    return;
  }
  return;
}

Assistant:

void BitMap::gen(OutputFile & o, uint32_t ind, uint32_t lb, uint32_t ub)
{
	if (first && bUsedYYBitmap)
	{
		o.wind(ind).ws("static const unsigned char ").wstring(opts->yybm).ws("[] = {");

		uint32_t c = 1, n = ub - lb;
		const BitMap *cb = first;

		while((cb = cb->next) != NULL) {
			++c;
		}
		BitMap *b = first;

		uint32_t *bm = new uint32_t[n];
		
		for (uint32_t i = 0, t = 1; b; i += n, t += 8)
		{
			memset(bm, 0, n * sizeof(uint32_t));

			for (uint32_t m = 0x80; b && m; m >>= 1)
			{
				b->i = i;
				b->m = m;
				doGen(b->go, b->on, bm, lb, m);
				b = const_cast<BitMap*>(b->next);
			}

			if (c > 8)
			{
				o.ws("\n").wind(ind+1).ws("/* table ").wu32(t).ws(" .. ").wu32(std::min(c, t+7)).ws(": ").wu32(i).ws(" */");
			}

			for (uint32_t j = 0; j < n; ++j)
			{
				if (j % 8 == 0)
				{
					o.ws("\n").wind(ind+1);
				}

				if (opts->yybmHexTable)
				{
					o.wu32_hex(bm[j]);
				}
				else
				{
					o.wu32_width(bm[j], 3);
				}
				o.ws(", ");
			}
		}

		o.ws("\n").wind(ind).ws("};\n");
		
		delete[] bm;
	}
}